

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManSetDefaultPars(Jf_Par_t *pPars)

{
  memset(&pPars->nReqTimeFlex,0,0xd8);
  pPars->nLutSize = 6;
  pPars->nCutNum = 8;
  pPars->nProcNum = 0;
  pPars->nRounds = 4;
  pPars->nRoundsEla = 1;
  pPars->nRelaxRatio = 0;
  pPars->nCoarseLimit = 3;
  pPars->nAreaTuner = 1;
  pPars->nVerbLimit = 5;
  pPars->DelayTarget = -1;
  pPars->fOptEdge = 1;
  pPars->fPower = 0;
  pPars->fCoarsen = 1;
  pPars->fFuncDsd = 0;
  pPars->fPureAig = 0;
  pPars->fCutHashing = 0;
  pPars->fCutSimple = 0;
  pPars->fVerbose = 0;
  pPars->fVeryVerbose = 0;
  pPars->nLutSizeMax = 0xc;
  pPars->nCutNumMax = 0x20;
  return;
}

Assistant:

void Lf_ManSetDefaultPars( Jf_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Jf_Par_t) );
    pPars->nLutSize     =  6;
    pPars->nCutNum      =  8;
    pPars->nProcNum     =  0;
    pPars->nRounds      =  4;
    pPars->nRoundsEla   =  1;
    pPars->nRelaxRatio  =  0;
    pPars->nCoarseLimit =  3;
    pPars->nAreaTuner   =  1;
    pPars->nVerbLimit   =  5;
    pPars->DelayTarget  = -1;
    pPars->fAreaOnly    =  0;
    pPars->fOptEdge     =  1; 
    pPars->fUseMux7     =  0;
    pPars->fPower       =  0;
    pPars->fCoarsen     =  1;
    pPars->fCutMin      =  0;
    pPars->fFuncDsd     =  0;
    pPars->fGenCnf      =  0;
    pPars->fPureAig     =  0;
    pPars->fCutHashing  =  0;
    pPars->fCutSimple   =  0;
    pPars->fVerbose     =  0;
    pPars->fVeryVerbose =  0;
    pPars->nLutSizeMax  =  LF_LEAF_MAX;
    pPars->nCutNumMax   =  LF_CUT_MAX;
}